

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O0

Label * __thiscall Label::writeXml_abi_cxx11_(Label *this,int indent)

{
  int iVar1;
  uint uVar2;
  ostream *poVar3;
  int in_EDX;
  undefined4 in_register_00000034;
  Widget *this_00;
  Util local_348 [39];
  allocator local_321;
  string local_320 [39];
  allocator local_2f9;
  string local_2f8 [32];
  TextShadow local_2d8;
  allocator local_2b1;
  string local_2b0 [39];
  allocator local_289;
  string local_288 [39];
  allocator local_261;
  string local_260 [32];
  undefined1 local_240 [71];
  allocator local_1f9;
  string local_1f8 [48];
  Util local_1c8 [32];
  stringstream local_1a8 [8];
  stringstream str;
  ostream local_198 [380];
  int local_1c;
  Widget *pWStack_18;
  int indent_local;
  Label *this_local;
  
  this_00 = (Widget *)CONCAT44(in_register_00000034,indent);
  local_1c = in_EDX;
  pWStack_18 = this_00;
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  Util::getIndent_abi_cxx11_(local_1c8,local_1c);
  poVar3 = std::operator<<(local_198,(string *)local_1c8);
  std::operator<<(poVar3,"<Label");
  std::__cxx11::string::~string((string *)local_1c8);
  Widget::writeXmlAttributes(this_00,(stringstream *)local_1a8);
  poVar3 = std::operator<<(local_198,">");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  iVar1 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"Text",&local_1f9);
  std::__cxx11::string::string((string *)(local_240 + 0x20),(string *)&this_00[1].numChildren);
  Util::writeXmlElement<std::__cxx11::string>
            ((stringstream *)local_1a8,iVar1,(string *)local_1f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_240 + 0x20)
            );
  std::__cxx11::string::~string((string *)(local_240 + 0x20));
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  uVar2 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_260,"FontData",&local_261);
  FontData::writeXml((FontData *)local_240,indent + 0xe0,(string *)(ulong)uVar2);
  std::operator<<(local_198,(string *)local_240);
  std::__cxx11::string::~string((string *)local_240);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator((allocator<char> *)&local_261);
  iVar1 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_288,"TextTrimming",&local_289);
  Util::writeXmlElement<TextTrimming>
            ((stringstream *)local_1a8,iVar1,(string *)local_288,
             *(TextTrimming *)&this_00[1].field_0x68);
  std::__cxx11::string::~string(local_288);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  iVar1 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b0,"HasTextShadow",&local_2b1);
  Util::writeXmlElement<bool>
            ((stringstream *)local_1a8,iVar1,(string *)local_2b0,
             (bool)(*(byte *)&this_00[1]._vptr_Widget & 1));
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  TextShadow::writeXml_abi_cxx11_(&local_2d8,indent + 0x118);
  std::operator<<(local_198,(string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2d8);
  iVar1 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f8,"HorizontalAlignment",&local_2f9);
  Util::writeXmlElement<HorizontalAlignment>
            ((stringstream *)local_1a8,iVar1,(string *)local_2f8,
             (HorizontalAlignment)this_00[1].transform.transY);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  iVar1 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_320,"VerticalAlignment",&local_321);
  Util::writeXmlElement<VerticalAlignment>
            ((stringstream *)local_1a8,iVar1,(string *)local_320,
             (VerticalAlignment)this_00[1].transform.transZ);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  Util::getIndent_abi_cxx11_(local_348,local_1c);
  poVar3 = std::operator<<(local_198,(string *)local_348);
  std::operator<<(poVar3,"</Label>");
  std::__cxx11::string::~string((string *)local_348);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return this;
}

Assistant:

std::string Label::writeXml(int indent)
{
	std::stringstream str;
	str << Util::getIndent(indent) << "<Label";

	Widget::writeXmlAttributes(str);
	str << ">" << std::endl;

	Util::writeXmlElement(str, indent + 1, "Text", text);
	str << font.writeXml(indent + 1);
	Util::writeXmlElement(str, indent + 1, "TextTrimming", textTrimming);
	Util::writeXmlElement(str, indent + 1, "HasTextShadow", hasTextShadow);
	str << textShadow.writeXml(indent + 1);
	Util::writeXmlElement(str, indent + 1, "HorizontalAlignment", horizontalAlignment);
	Util::writeXmlElement(str, indent + 1, "VerticalAlignment", verticalAlignment);

	str << Util::getIndent(indent) << "</Label>";

	return str.str();
}